

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t FSE_compress_wksp(void *dst,size_t dstSize,void *src,size_t srcSize,uint maxSymbolValue,
                        uint tableLog,void *workSpace,size_t wkspSize)

{
  void *dst_00;
  uint maxSymbolValue_00;
  int iVar1;
  size_t sVar2;
  int iVar3;
  size_t sVar4;
  uint maxTableLog;
  ulong uVar5;
  uint maxSymbolValue_local;
  uint local_64c;
  void *local_648;
  void *local_640;
  S16 norm [256];
  uint count [256];
  
  iVar1 = 1 << ((char)tableLog - 1U & 0x1f);
  iVar3 = 0x400;
  if (0xc < tableLog) {
    iVar3 = 1 << ((char)tableLog - 2U & 0x1f);
  }
  if (wkspSize < iVar1 + maxSymbolValue * 2 + iVar3 + 3) {
    return 0xffffffffffffffd4;
  }
  if (1 < srcSize) {
    uVar5 = (ulong)(iVar1 + maxSymbolValue * 2 + 3);
    local_640 = (void *)((long)workSpace + uVar5 * 4);
    sVar4 = wkspSize + uVar5 * -4;
    maxSymbolValue_local = maxSymbolValue;
    if (maxSymbolValue == 0) {
      maxSymbolValue_local = 0xff;
    }
    maxTableLog = 0xb;
    if (tableLog != 0) {
      maxTableLog = tableLog;
    }
    local_648 = dst;
    sVar2 = HIST_count_wksp(count,&maxSymbolValue_local,src,srcSize,local_640,sVar4);
    maxSymbolValue_00 = maxSymbolValue_local;
    if (0xffffffffffffff88 < sVar2) {
      return sVar2;
    }
    if (sVar2 == srcSize) {
      return 1;
    }
    if (srcSize >> 7 <= sVar2 && sVar2 != 1) {
      local_64c = FSE_optimalTableLog(maxTableLog,srcSize,maxSymbolValue_local);
      sVar2 = FSE_normalizeCount(norm,local_64c,count,srcSize,maxSymbolValue_00);
      if (0xffffffffffffff88 < sVar2) {
        return sVar2;
      }
      sVar2 = FSE_writeNCount(local_648,dstSize,norm,maxSymbolValue_00,local_64c);
      if (0xffffffffffffff88 < sVar2) {
        return sVar2;
      }
      sVar4 = FSE_buildCTable_wksp
                        ((FSE_CTable *)workSpace,norm,maxSymbolValue_00,local_64c,local_640,sVar4);
      if (0xffffffffffffff88 < sVar4) {
        return sVar4;
      }
      dst_00 = (void *)((long)local_648 + sVar2);
      sVar4 = FSE_compress_usingCTable(dst_00,dstSize - sVar2,src,srcSize,(FSE_CTable *)workSpace);
      if (0xffffffffffffff88 < sVar4) {
        return sVar4;
      }
      if (sVar4 != 0) {
        uVar5 = (long)dst_00 + (sVar4 - (long)local_648);
        if (srcSize - 1 <= uVar5) {
          return 0;
        }
        return uVar5;
      }
    }
  }
  return 0;
}

Assistant:

size_t FSE_compress_wksp (void* dst, size_t dstSize, const void* src, size_t srcSize, unsigned maxSymbolValue, unsigned tableLog, void* workSpace, size_t wkspSize)
{
    BYTE* const ostart = (BYTE*) dst;
    BYTE* op = ostart;
    BYTE* const oend = ostart + dstSize;

    unsigned count[FSE_MAX_SYMBOL_VALUE+1];
    S16   norm[FSE_MAX_SYMBOL_VALUE+1];
    FSE_CTable* CTable = (FSE_CTable*)workSpace;
    size_t const CTableSize = FSE_CTABLE_SIZE_U32(tableLog, maxSymbolValue);
    void* scratchBuffer = (void*)(CTable + CTableSize);
    size_t const scratchBufferSize = wkspSize - (CTableSize * sizeof(FSE_CTable));

    /* init conditions */
    if (wkspSize < FSE_WKSP_SIZE_U32(tableLog, maxSymbolValue)) return ERROR(tableLog_tooLarge);
    if (srcSize <= 1) return 0;  /* Not compressible */
    if (!maxSymbolValue) maxSymbolValue = FSE_MAX_SYMBOL_VALUE;
    if (!tableLog) tableLog = FSE_DEFAULT_TABLELOG;

    /* Scan input and build symbol stats */
    {   CHECK_V_F(maxCount, HIST_count_wksp(count, &maxSymbolValue, src, srcSize, scratchBuffer, scratchBufferSize) );
        if (maxCount == srcSize) return 1;   /* only a single symbol in src : rle */
        if (maxCount == 1) return 0;         /* each symbol present maximum once => not compressible */
        if (maxCount < (srcSize >> 7)) return 0;   /* Heuristic : not compressible enough */
    }

    tableLog = FSE_optimalTableLog(tableLog, srcSize, maxSymbolValue);
    CHECK_F( FSE_normalizeCount(norm, tableLog, count, srcSize, maxSymbolValue) );

    /* Write table description header */
    {   CHECK_V_F(nc_err, FSE_writeNCount(op, oend-op, norm, maxSymbolValue, tableLog) );
        op += nc_err;
    }

    /* Compress */
    CHECK_F( FSE_buildCTable_wksp(CTable, norm, maxSymbolValue, tableLog, scratchBuffer, scratchBufferSize) );
    {   CHECK_V_F(cSize, FSE_compress_usingCTable(op, oend - op, src, srcSize, CTable) );
        if (cSize == 0) return 0;   /* not enough space for compressed data */
        op += cSize;
    }

    /* check compressibility */
    if ( (size_t)(op-ostart) >= srcSize-1 ) return 0;

    return op-ostart;
}